

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# effect-handler-general.c
# Opt level: O3

_Bool effect_handler_GRANITE(effect_handler_context_t_conflict *context)

{
  ulong uVar1;
  trap *ptVar2;
  player_upkeep *ppVar3;
  chunk_conflict *c;
  _Bool daytime;
  
  ptVar2 = (context->origin).which.trap;
  square_set_feat(cave,ptVar2->grid,L'\x15');
  c = cave;
  if (cave->depth == 0) {
    daytime = is_daytime();
    expose_to_sun((chunk *)c,ptVar2->grid,daytime);
  }
  ppVar3 = player->upkeep;
  uVar1._0_4_ = ppVar3->update;
  uVar1._4_4_ = ppVar3->redraw;
  ppVar3->update = (int)(uVar1 | 0xc0000000000060);
  ppVar3->redraw = (int)((uVar1 | 0xc0000000000060) >> 0x20);
  return true;
}

Assistant:

bool effect_handler_GRANITE(effect_handler_context_t *context)
{
	struct trap *trap = context->origin.which.trap;
	square_set_feat(cave, trap->grid, FEAT_GRANITE);
	if (cave->depth == 0) expose_to_sun(cave, trap->grid, is_daytime());

	player->upkeep->update |= (PU_UPDATE_VIEW | PU_MONSTERS);
	player->upkeep->redraw |= (PR_MONLIST | PR_ITEMLIST);

	return true;
}